

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fClippingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_0::TriangleCaseBase::testRender(TriangleCaseBase *this)

{
  Vector<int,_4> *this_00;
  undefined4 uVar1;
  Surface *pSVar2;
  pointer log_00;
  int iVar3;
  int depthBits;
  RenderTarget *pRVar4;
  RenderContext *context;
  PixelFormat *colorBits;
  MessageBuilder *pMVar5;
  size_type sVar6;
  const_reference pvVar7;
  Vec4 *p;
  Vec4 *p_00;
  Vec4 *p_01;
  Vec4 *p_02;
  Vec4 *p_03;
  Vec4 *p_04;
  PixelBufferAccess local_70c8;
  PixelBufferAccess local_70a0;
  undefined4 local_7074;
  undefined4 local_7070;
  GLint colorLoc;
  GLint positionLoc;
  deUint32 programId;
  Surface *dstSurface;
  Context *ctx;
  undefined1 local_7050 [4];
  int contextNdx;
  float local_6ed0;
  float local_6ecc;
  float local_6ec8;
  float local_6ec4;
  MessageBuilder local_6ec0;
  float local_6d40;
  float local_6d3c;
  float local_6d38;
  float local_6d34;
  MessageBuilder local_6d30;
  float local_6bb0;
  float local_6bac;
  float local_6ba8;
  float local_6ba4;
  MessageBuilder local_6ba0;
  undefined1 local_6a20 [8];
  string c2Properties;
  string c1Properties;
  string c0Properties;
  string v2Properties;
  string v1Properties;
  string v0Properties;
  size_t ndx;
  MessageBuilder local_67d8;
  size_t *local_6658;
  Surface *surfaces [2];
  Context *contexts [2];
  undefined1 local_6630 [8];
  Surface refSurface;
  Surface testSurface;
  PositionColorShader program;
  MultisamplePixelBufferAccess local_6480;
  MultisamplePixelBufferAccess local_6458;
  undefined1 local_6430 [8];
  ReferenceContext refContext;
  ReferenceContextBuffers buffers;
  undefined1 local_1f8 [8];
  ReferenceContextLimits limits;
  undefined1 local_190 [8];
  GLContext glesContext;
  TestLog *log;
  int verticesPerTriangle;
  int numSamples;
  TriangleCaseBase *this_local;
  
  pRVar4 = gles2::Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  iVar3 = tcu::RenderTarget::getNumSamples(pRVar4);
  iVar3 = de::max<int>(iVar3,1);
  glesContext.m_programs.
  super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)tcu::TestContext::getLog
                          ((this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode
                           .m_testCtx);
  context = gles2::Context::getRenderContext((this->super_RenderTestCase).super_TestCase.m_context);
  log_00 = glesContext.m_programs.
           super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  this_00 = (Vector<int,_4> *)((long)&limits.extensionStr.field_2 + 8);
  tcu::Vector<int,_4>::Vector(this_00,0,0,200,200);
  sglr::GLContext::GLContext((GLContext *)local_190,context,(TestLog *)log_00,0,this_00);
  sglr::ReferenceContextLimits::ReferenceContextLimits((ReferenceContextLimits *)local_1f8);
  pRVar4 = gles2::Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  colorBits = tcu::RenderTarget::getPixelFormat(pRVar4);
  pRVar4 = gles2::Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  depthBits = tcu::RenderTarget::getDepthBits(pRVar4);
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            ((ReferenceContextBuffers *)
             &refContext.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,colorBits,depthBits,0,200,200,iVar3);
  sglr::ReferenceContextBuffers::getColorbuffer
            (&local_6458,
             (ReferenceContextBuffers *)
             &refContext.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sglr::ReferenceContextBuffers::getDepthbuffer
            (&local_6480,
             (ReferenceContextBuffers *)
             &refContext.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sglr::ReferenceContextBuffers::getStencilbuffer
            ((MultisamplePixelBufferAccess *)&program.super_ShaderProgram.m_hasGeometryShader,
             (ReferenceContextBuffers *)
             &refContext.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sglr::ReferenceContext::ReferenceContext
            ((ReferenceContext *)local_6430,(ReferenceContextLimits *)local_1f8,&local_6458,
             &local_6480,
             (MultisamplePixelBufferAccess *)&program.super_ShaderProgram.m_hasGeometryShader);
  PositionColorShader::PositionColorShader((PositionColorShader *)&testSurface.m_pixels.m_cap);
  tcu::Surface::Surface((Surface *)&refSurface.m_pixels.m_cap,200,200);
  tcu::Surface::Surface((Surface *)local_6630,200,200);
  surfaces[1] = (Surface *)local_190;
  local_6658 = &refSurface.m_pixels.m_cap;
  surfaces[0] = (Surface *)local_6630;
  tcu::TestLog::operator<<
            (&local_67d8,
             (TestLog *)
             glesContext.m_programs.
             super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage,(BeginMessageToken *)&tcu::TestLog::Message)
  ;
  pMVar5 = tcu::MessageBuilder::operator<<(&local_67d8,(char (*) [16])"Viewport: left=");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&(this->m_viewport).left);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [9])"\tbottom=");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&(this->m_viewport).bottom);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [8])"\twidth=");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&(this->m_viewport).width);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [9])"\theight=");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&(this->m_viewport).height);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_67d8);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&ndx,
             (TestLog *)
             glesContext.m_programs.
             super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage,(BeginMessageToken *)&tcu::TestLog::Message)
  ;
  pMVar5 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&ndx,(char (*) [34])"Rendering triangles. Coordinates:");
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&ndx);
  v0Properties.field_2._8_8_ = 0;
  while( true ) {
    sVar6 = std::
            vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
            ::size(&this->m_polys);
    if (sVar6 <= (ulong)v0Properties.field_2._8_8_) break;
    pvVar7 = std::
             vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
             ::operator[](&this->m_polys,v0Properties.field_2._8_8_);
    Functional::(anonymous_namespace)::genClippingPointInfoString_abi_cxx11_
              ((string *)((long)&v1Properties.field_2 + 8),(_anonymous_namespace_ *)pvVar7,p);
    pvVar7 = std::
             vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
             ::operator[](&this->m_polys,v0Properties.field_2._8_8_);
    Functional::(anonymous_namespace)::genClippingPointInfoString_abi_cxx11_
              ((string *)((long)&v2Properties.field_2 + 8),(_anonymous_namespace_ *)&pvVar7->p1,p_00
              );
    pvVar7 = std::
             vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
             ::operator[](&this->m_polys,v0Properties.field_2._8_8_);
    Functional::(anonymous_namespace)::genClippingPointInfoString_abi_cxx11_
              ((string *)((long)&c0Properties.field_2 + 8),(_anonymous_namespace_ *)&pvVar7->p2,p_01
              );
    pvVar7 = std::
             vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
             ::operator[](&this->m_polys,v0Properties.field_2._8_8_);
    Functional::(anonymous_namespace)::genColorString_abi_cxx11_
              ((string *)((long)&c1Properties.field_2 + 8),(_anonymous_namespace_ *)&pvVar7->c0,p_02
              );
    pvVar7 = std::
             vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
             ::operator[](&this->m_polys,v0Properties.field_2._8_8_);
    Functional::(anonymous_namespace)::genColorString_abi_cxx11_
              ((string *)((long)&c2Properties.field_2 + 8),(_anonymous_namespace_ *)&pvVar7->c1,p_03
              );
    pvVar7 = std::
             vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
             ::operator[](&this->m_polys,v0Properties.field_2._8_8_);
    Functional::(anonymous_namespace)::genColorString_abi_cxx11_
              ((string *)local_6a20,(_anonymous_namespace_ *)&pvVar7->c2,p_04);
    tcu::TestLog::operator<<
              (&local_6ba0,
               (TestLog *)
               glesContext.m_programs.
               super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_6ba0,(char (*) [8])"\tv0 (x=");
    pvVar7 = std::
             vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
             ::operator[](&this->m_polys,v0Properties.field_2._8_8_);
    local_6ba4 = tcu::Vector<float,_4>::x(&pvVar7->p0);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_6ba4);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])"\ty=");
    pvVar7 = std::
             vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
             ::operator[](&this->m_polys,v0Properties.field_2._8_8_);
    local_6ba8 = tcu::Vector<float,_4>::y(&pvVar7->p0);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_6ba8);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])"\tz=");
    pvVar7 = std::
             vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
             ::operator[](&this->m_polys,v0Properties.field_2._8_8_);
    local_6bac = tcu::Vector<float,_4>::z(&pvVar7->p0);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_6bac);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])"\tw=");
    pvVar7 = std::
             vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
             ::operator[](&this->m_polys,v0Properties.field_2._8_8_);
    local_6bb0 = tcu::Vector<float,_4>::w(&pvVar7->p0);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_6bb0);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])")\t");
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&v1Properties.field_2 + 8));
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b88b2a);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&c1Properties.field_2 + 8));
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_6ba0);
    tcu::TestLog::operator<<
              (&local_6d30,
               (TestLog *)
               glesContext.m_programs.
               super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_6d30,(char (*) [8])"\tv1 (x=");
    pvVar7 = std::
             vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
             ::operator[](&this->m_polys,v0Properties.field_2._8_8_);
    local_6d34 = tcu::Vector<float,_4>::x(&pvVar7->p1);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_6d34);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])"\ty=");
    pvVar7 = std::
             vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
             ::operator[](&this->m_polys,v0Properties.field_2._8_8_);
    local_6d38 = tcu::Vector<float,_4>::y(&pvVar7->p1);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_6d38);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])"\tz=");
    pvVar7 = std::
             vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
             ::operator[](&this->m_polys,v0Properties.field_2._8_8_);
    local_6d3c = tcu::Vector<float,_4>::z(&pvVar7->p1);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_6d3c);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])"\tw=");
    pvVar7 = std::
             vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
             ::operator[](&this->m_polys,v0Properties.field_2._8_8_);
    local_6d40 = tcu::Vector<float,_4>::w(&pvVar7->p1);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_6d40);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])")\t");
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&v2Properties.field_2 + 8));
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b88b2a);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&c2Properties.field_2 + 8));
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_6d30);
    tcu::TestLog::operator<<
              (&local_6ec0,
               (TestLog *)
               glesContext.m_programs.
               super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_6ec0,(char (*) [8])"\tv2 (x=");
    pvVar7 = std::
             vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
             ::operator[](&this->m_polys,v0Properties.field_2._8_8_);
    local_6ec4 = tcu::Vector<float,_4>::x(&pvVar7->p2);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_6ec4);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])"\ty=");
    pvVar7 = std::
             vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
             ::operator[](&this->m_polys,v0Properties.field_2._8_8_);
    local_6ec8 = tcu::Vector<float,_4>::y(&pvVar7->p2);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_6ec8);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])"\tz=");
    pvVar7 = std::
             vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
             ::operator[](&this->m_polys,v0Properties.field_2._8_8_);
    local_6ecc = tcu::Vector<float,_4>::z(&pvVar7->p2);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_6ecc);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])"\tw=");
    pvVar7 = std::
             vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
             ::operator[](&this->m_polys,v0Properties.field_2._8_8_);
    local_6ed0 = tcu::Vector<float,_4>::w(&pvVar7->p2);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_6ed0);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])")\t");
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&c0Properties.field_2 + 8));
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b88b2a);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_6a20);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_6ec0);
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_7050,
               (TestLog *)
               glesContext.m_programs.
               super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,
               (BeginMessageToken *)&tcu::TestLog::Message);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_7050,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_7050);
    std::__cxx11::string::~string((string *)local_6a20);
    std::__cxx11::string::~string((string *)(c2Properties.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(c1Properties.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(c0Properties.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(v2Properties.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(v1Properties.field_2._M_local_buf + 8));
    v0Properties.field_2._8_8_ = v0Properties.field_2._8_8_ + 1;
  }
  for (ctx._4_4_ = 0; ctx._4_4_ < 2; ctx._4_4_ = ctx._4_4_ + 1) {
    dstSurface = surfaces[(long)ctx._4_4_ + 1];
    _positionLoc = surfaces[(long)ctx._4_4_ + -1];
    colorLoc = (**(code **)(*(long *)dstSurface + 0x3a8))(dstSurface,&testSurface.m_pixels.m_cap);
    local_7070 = (**(code **)(*(long *)dstSurface + 0x2c8))(dstSurface,colorLoc,"a_position");
    local_7074 = (**(code **)(*(long *)dstSurface + 0x2c8))(dstSurface,colorLoc,"a_color");
    (**(code **)(*(long *)dstSurface + 0x150))(0,0,0,0x3f800000);
    (**(code **)(*(long *)dstSurface + 0x158))(0x3f800000);
    (**(code **)(*(long *)dstSurface + 0x168))(dstSurface,0x4100);
    (**(code **)(*(long *)dstSurface + 0x28))
              (dstSurface,(this->m_viewport).left,(this->m_viewport).bottom,(this->m_viewport).width
               ,(this->m_viewport).height);
    (**(code **)(*(long *)dstSurface + 0x3b0))(dstSurface,colorLoc);
    (**(code **)(*(long *)dstSurface + 0x280))(dstSurface,local_7070);
    (**(code **)(*(long *)dstSurface + 0x280))(dstSurface,local_7074);
    pSVar2 = dstSurface;
    uVar1 = local_7070;
    pvVar7 = std::
             vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
             ::operator[](&this->m_polys,0);
    (**(code **)(*(long *)pSVar2 + 0x270))(pSVar2,uVar1,4,0x1406,0,0x20,pvVar7);
    pSVar2 = dstSurface;
    uVar1 = local_7074;
    pvVar7 = std::
             vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
             ::operator[](&this->m_polys,0);
    (**(code **)(*(long *)pSVar2 + 0x270))(pSVar2,uVar1,4,0x1406,0,0x20,&pvVar7->c0);
    pSVar2 = dstSurface;
    sVar6 = std::
            vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
            ::size(&this->m_polys);
    (**(code **)(*(long *)pSVar2 + 0x340))(pSVar2,4,0,(int)sVar6 * 3);
    (**(code **)(*(long *)dstSurface + 0x288))(dstSurface,local_7070);
    (**(code **)(*(long *)dstSurface + 0x288))(dstSurface,local_7074);
    (**(code **)(*(long *)dstSurface + 0x3b0))(dstSurface,0);
    (**(code **)(*(long *)dstSurface + 0x3b8))(dstSurface,colorLoc);
    (**(code **)(*(long *)dstSurface + 0x3d0))();
    (**(code **)(*(long *)dstSurface + 0x400))(dstSurface,_positionLoc,0,0,200);
  }
  tcu::Surface::getAccess(&local_70a0,(Surface *)&refSurface.m_pixels.m_cap);
  tcu::Surface::getAccess(&local_70c8,(Surface *)local_6630);
  (*(this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])
            (this,&local_70a0,&local_70c8);
  tcu::Surface::~Surface((Surface *)local_6630);
  tcu::Surface::~Surface((Surface *)&refSurface.m_pixels.m_cap);
  PositionColorShader::~PositionColorShader((PositionColorShader *)&testSurface.m_pixels.m_cap);
  sglr::ReferenceContext::~ReferenceContext((ReferenceContext *)local_6430);
  sglr::ReferenceContextBuffers::~ReferenceContextBuffers
            ((ReferenceContextBuffers *)
             &refContext.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sglr::ReferenceContextLimits::~ReferenceContextLimits((ReferenceContextLimits *)local_1f8);
  sglr::GLContext::~GLContext((GLContext *)local_190);
  return;
}

Assistant:

void TriangleCaseBase::testRender (void)
{
	using tcu::TestLog;

	const int numSamples			= de::max(m_context.getRenderTarget().getNumSamples(), 1);
	const int verticesPerTriangle	= 3;

	tcu::TestLog&					log			= m_testCtx.getLog();
	sglr::GLContext					glesContext	(m_context.getRenderContext(), log, 0, tcu::IVec4(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE));
	sglr::ReferenceContextLimits	limits;
	sglr::ReferenceContextBuffers	buffers		(m_context.getRenderTarget().getPixelFormat(), m_context.getRenderTarget().getDepthBits(), 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE, numSamples);
	sglr::ReferenceContext			refContext	(limits, buffers.getColorbuffer(), buffers.getDepthbuffer(), buffers.getStencilbuffer());
	PositionColorShader				program;
	tcu::Surface					testSurface	(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	tcu::Surface					refSurface	(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	sglr::Context*					contexts[2] = {&glesContext, &refContext};
	tcu::Surface*					surfaces[2] = {&testSurface, &refSurface};

	// log the purpose of the test
	log << TestLog::Message << "Viewport: left=" << m_viewport.left << "\tbottom=" << m_viewport.bottom << "\twidth=" << m_viewport.width << "\theight=" << m_viewport.height << TestLog::EndMessage;
	log << TestLog::Message << "Rendering triangles. Coordinates:" << TestLog::EndMessage;
	for (size_t ndx = 0; ndx < m_polys.size(); ++ndx)
	{
		const std::string v0Properties = genClippingPointInfoString(m_polys[ndx].p0);
		const std::string v1Properties = genClippingPointInfoString(m_polys[ndx].p1);
		const std::string v2Properties = genClippingPointInfoString(m_polys[ndx].p2);
		const std::string c0Properties = genColorString(m_polys[ndx].c0);
		const std::string c1Properties = genColorString(m_polys[ndx].c1);
		const std::string c2Properties = genColorString(m_polys[ndx].c2);

		log << TestLog::Message << "\tv0 (x=" << m_polys[ndx].p0.x() << "\ty=" << m_polys[ndx].p0.y() << "\tz=" << m_polys[ndx].p0.z() << "\tw=" << m_polys[ndx].p0.w() << ")\t" << v0Properties << "\t" << c0Properties << TestLog::EndMessage;
		log << TestLog::Message << "\tv1 (x=" << m_polys[ndx].p1.x() << "\ty=" << m_polys[ndx].p1.y() << "\tz=" << m_polys[ndx].p1.z() << "\tw=" << m_polys[ndx].p1.w() << ")\t" << v1Properties << "\t" << c1Properties << TestLog::EndMessage;
		log << TestLog::Message << "\tv2 (x=" << m_polys[ndx].p2.x() << "\ty=" << m_polys[ndx].p2.y() << "\tz=" << m_polys[ndx].p2.z() << "\tw=" << m_polys[ndx].p2.w() << ")\t" << v2Properties << "\t" << c2Properties << TestLog::EndMessage;
		log << TestLog::Message << TestLog::EndMessage;
	}

	// render test image
	for (int contextNdx = 0; contextNdx < 2; ++contextNdx)
	{
		sglr::Context&	ctx				= *contexts[contextNdx];
		tcu::Surface&	dstSurface		= *surfaces[contextNdx];
		const deUint32	programId		= ctx.createProgram(&program);
		const GLint		positionLoc		= ctx.getAttribLocation(programId, "a_position");
		const GLint		colorLoc		= ctx.getAttribLocation(programId, "a_color");

		ctx.clearColor					(0, 0, 0, 1);
		ctx.clearDepthf					(1.0f);
		ctx.clear						(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		ctx.viewport					(m_viewport.left, m_viewport.bottom, m_viewport.width, m_viewport.height);
		ctx.useProgram					(programId);
		ctx.enableVertexAttribArray		(positionLoc);
		ctx.enableVertexAttribArray		(colorLoc);
		ctx.vertexAttribPointer			(positionLoc,	4, GL_FLOAT, GL_FALSE, sizeof(GLfloat[8]), &m_polys[0].p0);
		ctx.vertexAttribPointer			(colorLoc,		4, GL_FLOAT, GL_FALSE, sizeof(GLfloat[8]), &m_polys[0].c0);
		ctx.drawArrays					(GL_TRIANGLES, 0, verticesPerTriangle * (glw::GLsizei)m_polys.size());
		ctx.disableVertexAttribArray	(positionLoc);
		ctx.disableVertexAttribArray	(colorLoc);
		ctx.useProgram					(0);
		ctx.deleteProgram				(programId);
		ctx.finish						();

		ctx.readPixels(dstSurface, 0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	}

	verifyImage(testSurface.getAccess(), refSurface.getAccess());
}